

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O3

void __thiscall xs::TcpServer::~TcpServer(TcpServer *this)

{
  deBool dVar1;
  deSocketState dVar2;
  const_iterator __position;
  iterator iVar3;
  const_iterator __position_00;
  int __fd;
  const_iterator in_RSI;
  long lVar4;
  ulong uVar5;
  pointer ppCVar6;
  vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> allConnections;
  vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> local_48;
  
  this->_vptr_TcpServer = (_func_int **)&PTR__TcpServer_0012a950;
  local_48.super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (ConnectionHandler **)0x0;
  local_48.super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ConnectionHandler **)0x0;
  local_48.super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = deMutex_tryLock((this->m_connectionListLock).m_mutex);
  __fd = (int)in_RSI._M_current;
  if (dVar1 == 1) {
    ppCVar6 = (this->m_liveConnections).
              super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_liveConnections).
                  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3;
    if (lVar4 < 1) {
      __position_00._M_current = (ConnectionHandler **)0x0;
    }
    else {
      uVar5 = lVar4 + 1;
      __position._M_current = (ConnectionHandler **)0x0;
      do {
        in_RSI._M_current = __position._M_current;
        iVar3 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::
                insert(&local_48,__position,ppCVar6);
        __position._M_current = iVar3._M_current + 1;
        ppCVar6 = ppCVar6 + 1;
        uVar5 = uVar5 - 1;
        __position_00._M_current =
             local_48.
             super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      } while (1 < uVar5);
    }
    ppCVar6 = (this->m_doneConnections).
              super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_doneConnections).
                  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3;
    if (0 < lVar4) {
      uVar5 = lVar4 + 1;
      do {
        in_RSI._M_current = __position_00._M_current;
        iVar3 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::
                insert(&local_48,__position_00,ppCVar6);
        __position_00._M_current = iVar3._M_current + 1;
        ppCVar6 = ppCVar6 + 1;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    deMutex_unlock((this->m_connectionListLock).m_mutex);
    for (ppCVar6 = local_48.
                   super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; __fd = (int)in_RSI._M_current,
        ppCVar6 !=
        local_48.
        super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppCVar6 = ppCVar6 + 1) {
      if (*ppCVar6 != (ConnectionHandler *)0x0) {
        (*((*ppCVar6)->super_Thread)._vptr_Thread[1])();
      }
    }
  }
  dVar2 = deSocket_getState((this->m_socket).m_socket);
  if (dVar2 != DE_SOCKETSTATE_CLOSED) {
    de::Socket::close(&this->m_socket,__fd);
  }
  if (local_48.super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (ConnectionHandler **)0x0) {
    operator_delete(local_48.
                    super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ppCVar6 = (this->m_doneConnections).
            super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar6 != (pointer)0x0) {
    operator_delete(ppCVar6,(long)(this->m_doneConnections).
                                  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar6
                   );
  }
  ppCVar6 = (this->m_liveConnections).
            super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar6 != (pointer)0x0) {
    operator_delete(ppCVar6,(long)(this->m_liveConnections).
                                  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar6
                   );
  }
  de::Mutex::~Mutex(&this->m_connectionListLock);
  de::Socket::~Socket(&this->m_socket);
  return;
}

Assistant:

TcpServer::~TcpServer (void)
{
	try
	{
		std::vector<ConnectionHandler*> allConnections;

		if (m_connectionListLock.tryLock())
		{
			// \note [pyry] It is possible that cleanup actually fails.
			try
			{
				std::copy(m_liveConnections.begin(), m_liveConnections.end(), std::inserter(allConnections, allConnections.end()));
				std::copy(m_doneConnections.begin(), m_doneConnections.end(), std::inserter(allConnections, allConnections.end()));
			}
			catch (...)
			{
			}
			m_connectionListLock.unlock();
		}

		for (std::vector<ConnectionHandler*>::const_iterator i = allConnections.begin(); i != allConnections.end(); i++)
			delete *i;

		if (m_socket.getState() != DE_SOCKETSTATE_CLOSED)
			m_socket.close();
	}
	catch (...)
	{
		// Nada, we're at destructor.
	}
}